

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O2

void __thiscall
helics::JsonTranslatorOperation::JsonTranslatorOperation(JsonTranslatorOperation *this)

{
  (this->super_TranslatorOperations)._vptr_TranslatorOperations =
       (_func_int **)&PTR__JsonTranslatorOperation_00456368;
  std::make_shared<helics::JsonTranslatorOperator>();
  return;
}

Assistant:

JsonTranslatorOperation::JsonTranslatorOperation(): to(std::make_shared<JsonTranslatorOperator>())
{
}